

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

string * PacketProcessor::DickWinder(string *__return_storage_ptr__,string *str,uchar emulti)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  _Alloc_hider *p_Var7;
  ulong uVar8;
  uint uVar9;
  string buffer;
  string newstr;
  _Alloc_hider local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  _Alloc_hider local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  string *local_38;
  
  local_58._M_p = &local_48;
  local_50 = 0;
  local_48 = '\0';
  sVar2 = str->_M_string_length;
  local_78._M_p = &local_68;
  local_70 = 0;
  local_68 = '\0';
  if ((int)CONCAT71(in_register_00000011,emulti) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  else {
    std::__cxx11::string::reserve((ulong)&local_58);
    uVar9 = (uint)sVar2;
    local_38 = __return_storage_ptr__;
    if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        p_Var7 = &local_78;
        if (((byte)(str->_M_dataplus)._M_p[uVar8] % emulti != 0) &&
           (p_Var7 = &local_58, local_70 != 0)) {
          pcVar6 = local_78._M_p + local_70 + -1;
          _Var4._M_p = local_78._M_p;
          if (local_78._M_p < pcVar6) {
            do {
              pcVar5 = _Var4._M_p + 1;
              cVar1 = *_Var4._M_p;
              *_Var4._M_p = *pcVar6;
              *pcVar6 = cVar1;
              pcVar6 = pcVar6 + -1;
              _Var4._M_p = pcVar5;
            } while (pcVar5 < pcVar6);
          }
          std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_p);
          local_70 = 0;
          *local_78._M_p = '\0';
        }
        std::__cxx11::string::push_back((char)p_Var7);
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uVar9 & 0x7fffffff));
    }
    __return_storage_ptr__ = local_38;
    if (local_70 != 0) {
      pcVar6 = local_78._M_p + local_70 + -1;
      _Var4._M_p = local_78._M_p;
      if (local_78._M_p < pcVar6) {
        do {
          pcVar5 = _Var4._M_p + 1;
          cVar1 = *_Var4._M_p;
          *_Var4._M_p = *pcVar6;
          *pcVar6 = cVar1;
          pcVar6 = pcVar6 + -1;
          _Var4._M_p = pcVar5;
        } while (pcVar5 < pcVar6);
      }
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_58._M_p == &local_48) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
    }
    __return_storage_ptr__->_M_string_length = local_50;
    local_50 = 0;
    local_48 = '\0';
    local_58._M_p = &local_48;
  }
  if (local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::DickWinder(const std::string &str, unsigned char emulti)
{
	std::string newstr;
	int length = str.length();
	std::string buffer;
	unsigned char c;

	if (emulti == 0)
	{
		return str;
	}

	newstr.reserve(length);

	for (int i = 0; i < length; ++i)
	{
		c = str[i];

		if (c % emulti == 0)
		{
			buffer += c;
		}
		else
		{
			if (buffer.length() > 0)
			{
				std::reverse(buffer.begin(), buffer.end());
				newstr += buffer;
				buffer.clear();
			}
			newstr += c;
		}
	}

	if (buffer.length() > 0)
	{
		std::reverse(buffer.begin(), buffer.end());
		newstr += buffer;
	}

	return newstr;
}